

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::
PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>::addHandler
          (PromiseDataBase<(anonymous_namespace)::Foo,_void_(const_(anonymous_namespace)::Foo_&)>
           *this,function<void_(const_(anonymous_namespace)::Foo_&)> *handler)

{
  QVector<Handler> *this_00;
  qsizetype *pqVar1;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> **pppVar2;
  _Manager_type p_Var3;
  Data *pDVar4;
  long lVar5;
  pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *ppVar6;
  long lVar7;
  QThread *p;
  qsizetype qVar8;
  qsizetype qVar9;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
  *in_RCX;
  qsizetype extraout_RDX;
  qsizetype extraout_RDX_00;
  long lVar10;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *ppVar11;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *this_01;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *ppVar12;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *ppVar13;
  QWriteLocker lock;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> local_90;
  pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> local_60;
  
  lock.q_val = (quintptr)&this->m_lock;
  QWriteLocker::relock(&lock);
  p = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer(&local_90.first,p);
  local_90.second.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_90.second.super__Function_base._M_functor._8_8_ = 0;
  local_90.second.super__Function_base._M_manager = (_Manager_type)0x0;
  local_90.second._M_invoker = handler->_M_invoker;
  p_Var3 = (handler->super__Function_base)._M_manager;
  if (p_Var3 != (_Manager_type)0x0) {
    in_RCX = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
              *)&local_90.second;
    local_90.second.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(handler->super__Function_base)._M_functor;
    local_90.second.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(handler->super__Function_base)._M_functor + 8);
    (handler->super__Function_base)._M_manager = (_Manager_type)0x0;
    handler->_M_invoker = (_Invoker_type)0x0;
    local_90.second.super__Function_base._M_manager = p_Var3;
  }
  this_00 = &this->m_handlers;
  pDVar4 = (this->m_handlers).d.d;
  lVar5 = (this->m_handlers).d.size;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    qVar9 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
            ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                              *)this_00);
    if (qVar9 == 0) {
      if ((lVar5 != 0) ||
         (qVar9 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                  ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                                      *)this_00), qVar9 == 0)) goto LAB_00113cc9;
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::pair
                ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>
                  *)((this->m_handlers).d.ptr + -1),&local_90);
      pppVar2 = &(this->m_handlers).d.ptr;
      *pppVar2 = *pppVar2 + -1;
    }
    else {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::pair
                ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>
                  *)((this->m_handlers).d.ptr + lVar5),&local_90);
    }
    pqVar1 = &(this->m_handlers).d.size;
    *pqVar1 = *pqVar1 + 1;
    goto LAB_00113da8;
  }
LAB_00113cc9:
  std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::pair
            (&local_60,&local_90);
  lVar10 = extraout_RDX;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
  goto LAB_00113ce9;
  qVar8 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
          ::freeSpaceAtEnd((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                            *)this_00);
  qVar9 = lVar5;
  if (qVar8 < 1) {
    qVar9 = QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
            ::freeSpaceAtBegin((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                                *)this_00);
    lVar10 = extraout_RDX_00;
    if (qVar9 < 1) {
LAB_00113ce9:
      QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
      ::reallocateAndGrow((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                           *)this_00,GrowsAtEnd,lVar10,in_RCX);
    }
    else {
      lVar7 = (pDVar4->super_QArrayData).alloc;
      lVar10 = lVar5 * 3;
      in_RCX = (QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>_>
                *)(lVar7 * 2);
      if (SBORROW8(lVar10,(long)in_RCX) == lVar10 + lVar7 * -2 < 0) goto LAB_00113ce9;
      ppVar12 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>
                 *)(this->m_handlers).d.ptr;
      if (ppVar12 !=
          (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)0x0
          && lVar5 != 0) {
        ppVar11 = ppVar12 + -qVar9 + lVar5;
        this_01 = ppVar12;
        ppVar13 = ppVar11;
        if (ppVar12 < ppVar11) {
          ppVar13 = ppVar12;
        }
        for (; this_01 + -qVar9 != ppVar13; this_01 = this_01 + 1) {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
          pair(this_01 + -qVar9,this_01);
        }
        for (; ppVar13 != ppVar11; ppVar13 = ppVar13 + 1) {
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
          operator=(ppVar13,this_01);
          this_01 = this_01 + 1;
        }
        ppVar13 = ppVar12;
        if (ppVar12 < ppVar11) {
          ppVar13 = ppVar11;
        }
        while (this_01 != ppVar13) {
          this_01 = this_01 + -1;
          std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
          ~pair(this_01);
        }
      }
      (this->m_handlers).d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_double_&)>_> *)(ppVar12 + -qVar9);
    }
    qVar9 = (this->m_handlers).d.size;
  }
  ppVar6 = (this->m_handlers).d.ptr;
  if (qVar9 - lVar5 < 1) {
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *
               )(ppVar6 + qVar9),&local_60);
  }
  else {
    lVar10 = -(qVar9 - lVar5);
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::pair
              ((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *
               )(ppVar6 + qVar9),
               (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *
               )(ppVar6 + qVar9 + -1));
    ppVar12 = (pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
              (ppVar6 + qVar9 + -1);
    while (lVar10 = lVar10 + 1, lVar10 != 0) {
      std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
      operator=(ppVar12,ppVar12 + -1);
      ppVar12 = ppVar12 + -1;
    }
    std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::
    operator=((pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_> *)
              (ppVar6 + lVar5),&local_60);
  }
  (this->m_handlers).d.ptr = ppVar6;
  (this->m_handlers).d.size = qVar9 + 1;
  std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::~pair
            (&local_60);
LAB_00113da8:
  std::pair<QPointer<QThread>,_std::function<void_(const_(anonymous_namespace)::Foo_&)>_>::~pair
            (&local_90);
  QWriteLocker::~QWriteLocker(&lock);
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }